

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

vector<Token,_std::allocator<Token>_> * __thiscall
Tokenizer::Tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  bool bVar2;
  optional<Token> p;
  _Optional_payload_base<Token> _Stack_58;
  
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = false;
  do {
    NextToken((optional<Token> *)&_Stack_58,this);
    bVar1 = _Stack_58._M_engaged;
    if (_Stack_58._M_engaged == true) {
      std::vector<Token,std::allocator<Token>>::emplace_back<Token&>
                ((vector<Token,std::allocator<Token>> *)__return_storage_ptr__,(Token *)&_Stack_58);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Tokenizer successful return.",0x1c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      bVar2 = true;
      std::ostream::flush();
    }
    if (_Stack_58._M_engaged == true) {
      std::_Optional_payload_base<Token>::_M_destroy(&_Stack_58);
    }
  } while (bVar1 != false);
  if (!bVar2) {
    std::vector<Token,_std::allocator<Token>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Token> Tokenizer::Tokenize() {
	std::vector<Token> result;
	while (true) {
		auto p = NextToken();
		if (p.has_value()) {
			result.emplace_back(p.value());
		}
		else {
			std::cout << "Tokenizer successful return." << std::endl;
			return result;
		}
	}
}